

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

int compute_bitmap_width_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Drawonable *pAVar2;
  Am_Object local_48;
  Am_Drawonable *local_40;
  Am_Drawonable *drawonable;
  int local_30;
  int ret_height;
  int ret_width;
  Am_Image_Array local_20;
  Am_Image_Array image;
  Am_Object *self_local;
  
  image.data = (Am_Image_Array_Data *)self;
  Am_Image_Array::Am_Image_Array(&local_20);
  in_value = Am_Object::Get((Am_Object *)image.data,0xb0,0);
  Am_Image_Array::operator=(&local_20,in_value);
  bVar1 = Am_Image_Array::Valid(&local_20);
  if (bVar1) {
    Am_Object::Am_Object(&local_48,(Am_Object *)image.data);
    pAVar2 = GV_a_drawonable(&local_48);
    Am_Object::~Am_Object(&local_48);
    local_40 = pAVar2;
    (*pAVar2->_vptr_Am_Drawonable[0x16])(pAVar2,&local_20,&local_30,(long)&drawonable + 4);
    self_local._4_4_ = local_30;
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Image_Array::~Am_Image_Array(&local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, compute_bitmap_width)
{
  Am_Image_Array image;
  image = self.Get(Am_IMAGE);
  if (image.Valid()) {
    int ret_width, ret_height;
    Am_Drawonable *drawonable = GV_a_drawonable(self);
    drawonable->Get_Image_Size(image, ret_width, ret_height);
    return ret_width;
  }
  // no image, so return 0
  return 0;
}